

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  IString str;
  IString str_00;
  IString str_01;
  string_view sVar1;
  Function *this_00;
  bool bVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference other;
  mapped_type *pmVar5;
  char *__str;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  *this_01;
  Type in_R8;
  Name name;
  Name local_1a0;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_190;
  uintptr_t local_188;
  Name local_178;
  _Node_iterator_base<std::pair<const_wasm::Name,_unsigned_int>,_true> local_168;
  uintptr_t local_160;
  string_view local_150;
  string_view local_140;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_58;
  IString local_48;
  mapped_type local_34;
  Function *pFStack_30;
  mapped_type index;
  Function *func_local;
  Wasm2JSBuilder *this_local;
  Type type_local;
  IString ret;
  
  pFStack_30 = func;
  func_local = (Function *)this;
  this_local = (Wasm2JSBuilder *)type.id;
  IString::IString((IString *)&type_local);
  bVar2 = Type::isTuple((Type *)&this_local);
  if (!bVar2) {
    pmVar3 = std::
             unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
             ::operator[](&this->frees,(key_type *)&this_local);
    sVar4 = std::vector<wasm::IString,_std::allocator<wasm::IString>_>::size(pmVar3);
    if (sVar4 == 0) {
      pmVar5 = std::
               unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
               ::operator[](&this->temps,(key_type *)&this_local);
      local_34 = *pmVar5;
      *pmVar5 = local_34 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"wasm2js_",&local_d9);
      ::wasm::Type::toString_abi_cxx11_();
      std::operator+(&local_b8,&local_d8,&local_110);
      std::operator+(&local_98,&local_b8,"$");
      std::__cxx11::to_string(&local_130,local_34);
      std::operator+(&local_78,&local_98,&local_130);
      __str = (char *)std::__cxx11::string::c_str();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,__str);
      IString::IString(&local_48,local_58,false);
      IString::operator=((IString *)&type_local,&local_48);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      local_160 = type_local.id;
      str_01.str._M_str = (char *)ret.str._M_len;
      str_01.str._M_len = type_local.id;
      Name::Name((Name *)&local_150,str_01);
      local_140 = (string_view)fromName(this,(Name)local_150,Local);
      IString::operator=((IString *)&type_local,(IString *)&local_140);
    }
    else {
      pmVar3 = std::
               unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
               ::operator[](&this->frees,(key_type *)&this_local);
      other = std::vector<wasm::IString,_std::allocator<wasm::IString>_>::back(pmVar3);
      IString::operator=((IString *)&type_local,other);
      pmVar3 = std::
               unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
               ::operator[](&this->frees,(key_type *)&this_local);
      std::vector<wasm::IString,_std::allocator<wasm::IString>_>::pop_back(pmVar3);
    }
    this_01 = &pFStack_30->localIndices;
    local_188 = type_local.id;
    str_00.str._M_str = (char *)ret.str._M_len;
    str_00.str._M_len = type_local.id;
    Name::Name(&local_178,str_00);
    local_168._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
         ::find(this_01,&local_178);
    local_190._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
         ::end(&pFStack_30->localIndices);
    bVar2 = std::__detail::operator==(&local_168,&local_190);
    this_00 = pFStack_30;
    if (bVar2) {
      str.str._M_str = (char *)ret.str._M_len;
      str.str._M_len = type_local.id;
      Name::Name(&local_1a0,str);
      name.super_IString.str._M_str = (char *)this_local;
      name.super_IString.str._M_len = (size_t)local_1a0.super_IString.str._M_str;
      Builder::addVar((Builder *)this_00,(Function *)local_1a0.super_IString.str._M_len,name,in_R8);
    }
    sVar1._M_str = (char *)ret.str._M_len;
    sVar1._M_len = type_local.id;
    return (IString)sVar1;
  }
  __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                ,0xd3,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    if (frees[type].size() > 0) {
      ret = frees[type].back();
      frees[type].pop_back();
    } else {
      auto index = temps[type]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
      ret = fromName(ret, NameScope::Local);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }